

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerIteration.cpp
# Opt level: O2

EigenAnswer * PowerIterationMethod(EigenAnswer *__return_storage_ptr__,Matrix *m,int *iter)

{
  bool bVar1;
  int iVar2;
  initializer_list<EigenAnswer> c;
  initializer_list<EigenAnswer> c_00;
  EigenAnswer real;
  EigenAnswer bad;
  Vector third;
  Vector second;
  Vector first;
  Vector initial;
  EigenAnswer local_68;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  iVar2 = Matrix::GetRows(m);
  std::vector<double,_std::allocator<double>_>::vector(&initial,(long)iVar2,(allocator_type *)&bad);
  *initial.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 1.0;
  bad.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  bad.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  bad.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar2 = 0;
  do {
    *iter = iVar2;
    if (29999 < iVar2) {
      (__return_storage_ptr__->vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           bad.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           bad.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           bad.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      bad.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      bad.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      bad.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      __return_storage_ptr__->value = bad.value;
LAB_0010616c:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&bad);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&initial.super__Vector_base<double,_std::allocator<double>_>);
      return __return_storage_ptr__;
    }
    std::vector<double,_std::allocator<double>_>::vector(&first,&initial);
    Matrix::operator*(&second,m,&first);
    Matrix::operator*(&third,m,&second);
    RealValues(&real,&second,&third);
    EigenAnswer::EigenAnswer(&local_68,&real);
    c._M_len = 1;
    c._M_array = &local_68;
    bVar1 = TestEigen(m,c,1e-13);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_68);
    if (bVar1) {
      (__return_storage_ptr__->vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           real.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           real.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           real.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      real.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      real.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      real.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __return_storage_ptr__->value = real.value;
LAB_0010613c:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&real);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&third.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&second.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&first.super__Vector_base<double,_std::allocator<double>_>);
      goto LAB_0010616c;
    }
    OppositeRealValues(__return_storage_ptr__,&first,&second,&third);
    EigenAnswer::EigenAnswer(&local_68,__return_storage_ptr__);
    c_00._M_len = 1;
    c_00._M_array = &local_68;
    bVar1 = TestEigen(m,c_00,1e-13);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_68);
    if (bVar1) goto LAB_0010613c;
    EigenAnswer::operator=(&bad,__return_storage_ptr__);
    Matrix::operator*((Vector *)&local_48,m,&third);
    Utils::Normalized(&local_68.vector,(Vector *)&local_48);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&initial,&local_68);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_68);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    *iter = *iter + 1;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)__return_storage_ptr__);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&real);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&third.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&second.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&first.super__Vector_base<double,_std::allocator<double>_>);
    iVar2 = *iter + 3;
  } while( true );
}

Assistant:

EigenAnswer PowerIterationMethod(const Matrix &m, int &iter)
{
    const int n = m.GetRows();
    Vector initial(n);
    initial[0] = 1;

    EigenAnswer bad;
    for (iter = 0; iter < defaultMaxIterations; iter += 3)
    {
        auto first = initial;
        auto second = m * first;
        auto third = m * second;

        auto real = RealValues(second, third);
        if (TestEigen(m, {real}, PIeps))
        {
            return real;
        }

        auto opposite = OppositeRealValues(first, second, third);
        if (TestEigen(m, {opposite}, PIeps))
        {
            return opposite;
        }
        bad = opposite;
        initial = Utils::Normalized(m * third);
        iter++;
    }

    return bad;
}